

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::initExtraCompilerOutputs(VcprojGenerator *this)

{
  VCFilterList *this_00;
  QMakeProject *pQVar1;
  Data<QHashPrivate::Node<QString,_QList<QString>_>_> *pDVar2;
  QString string;
  QString string_00;
  QString string_01;
  Data *pDVar3;
  char16_t *pcVar4;
  Data *pDVar5;
  bool bVar6;
  ProStringList *pPVar7;
  ProStringList *pPVar8;
  ProStringList *pPVar9;
  Node<QString,_QList<QString>_> *pNVar10;
  QList<ProString> *vector;
  qsizetype qVar11;
  ProString *pPVar12;
  long lVar13;
  ulong uVar14;
  ProString *this_01;
  long in_FS_OFFSET;
  QAnyStringView QVar15;
  QByteArrayView QVar16;
  ProStringList *__range2;
  ProString var;
  ProString *pPVar17;
  VCFilter local_6b8;
  ProString local_268;
  ProString local_238;
  ProString local_208;
  ProString local_1d8;
  ProString local_1a8;
  ProString local_178;
  ProString local_148;
  ProString local_118;
  ProString local_e8;
  ProString local_b8;
  undefined1 local_88 [28];
  int iStack_6c;
  ProString *local_68;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (ProString *)0x0;
  local_58.size = 0;
  ProString::ProString((ProString *)&local_6b8,"FORMS");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,(ProString *)&local_6b8);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString((ProString *)local_88,"GENERATED_FILES");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,(ProString *)local_88);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_b8,"GENERATED_SOURCES");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_b8);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_e8,"HEADERS");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_e8);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_118,"IDLSOURCES");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_118);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_148,"LEXSOURCES");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_148);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_178,"RC_FILE");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_178);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_1a8,"RESOURCES");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_1a8);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_1d8,"RES_FILE");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_1d8);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_208,"SOURCES");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_208);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_238,"TRANSLATIONS");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_238);
  QList<ProString>::end((QList<ProString> *)&local_58);
  ProString::ProString(&local_268,"YACCSOURCES");
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_268);
  QList<ProString>::end((QList<ProString> *)&local_58);
  if (&(local_268.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_268.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_238.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_238.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_238.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_238.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_238.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_208.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_208.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1d8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1d8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_1a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_178.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_148.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_148.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_e8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_b8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_88._0_8_)->d).d = *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if ((ProString *)local_6b8.Name.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_6b8.Name.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_6b8,"QMAKE_EXTRA_COMPILERS");
  pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_6b8);
  if ((ProString *)local_6b8.Name.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_6b8.Name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((pPVar7->super_QList<ProString>).d.size != 0) {
    this_01 = (pPVar7->super_QList<ProString>).d.ptr;
    this_00 = &(this->vcProject).ExtraCompilersFiles;
    do {
      pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      local_88._8_8_ = ".input";
      local_88._0_8_ = this_01;
      ProString::ProString<ProString_const&,char_const(&)[7]>
                ((ProString *)&local_6b8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)local_88);
      pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_6b8);
      if ((ProString *)local_6b8.Name.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_6b8.Name.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_118.m_string.d.d = (Data *)0x0;
      local_118.m_string.d.ptr = (char16_t *)0x0;
      local_118.m_string.d.size = 0;
      lVar13 = (pPVar8->super_QList<ProString>).d.size;
      if (lVar13 != 0) {
        pPVar12 = (pPVar8->super_QList<ProString>).d.ptr;
        lVar13 = lVar13 * 0x30;
        do {
          local_6b8.Filter.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_6b8.Filter.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_6b8.Name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_6b8.Filter.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_6b8.Name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_6b8.Name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          ProString::ProString((ProString *)&local_6b8,pPVar12);
          pPVar9 = QMakeEvaluator::valuesRef
                             (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.project
                               )->super_QMakeEvaluator,(ProKey *)&local_6b8);
          pPVar17 = (pPVar9->super_QList<ProString>).d.ptr;
          QtPrivate::QCommonArrayOps<ProString>::growAppend
                    ((QCommonArrayOps<ProString> *)&local_118,pPVar17,
                     pPVar17 + (pPVar9->super_QList<ProString>).d.size);
          if ((ProString *)local_6b8.Name.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_6b8.Name.d.d)->super_QArrayData,2,0x10);
            }
          }
          pPVar12 = pPVar12 + 1;
          lVar13 = lVar13 + -0x30;
        } while (lVar13 != 0);
      }
      pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      local_88._8_8_ = ".output";
      local_88._0_8_ = this_01;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                ((ProString *)&local_6b8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)local_88);
      pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_6b8);
      if ((ProString *)local_6b8.Name.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_6b8.Name.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_6b8.Name.d.d)->super_QArrayData,2,0x10);
        }
      }
      memset(&local_6b8,0xaa,0x448);
      VCFilter::VCFilter(&local_6b8);
      ProString::toQString(&local_e8.m_string,this_01);
      ProString::ProString((ProString *)local_88,&local_e8.m_string);
      ProStringList::toQStringList((QStringList *)&local_148,(ProStringList *)&local_118);
      ProStringList::toQStringList((QStringList *)&local_178,pPVar9);
      extraCompilerName(&local_b8.m_string,this,(ProString *)local_88,(QStringList *)&local_148,
                        (QStringList *)&local_178);
      qVar11 = local_b8.m_string.d.size;
      pDVar5 = local_b8.m_string.d.d;
      pcVar4 = local_6b8.Name.d.ptr;
      pDVar3 = local_6b8.Name.d.d;
      local_b8.m_string.d.d = local_6b8.Name.d.d;
      local_6b8.Name.d.d = pDVar5;
      local_6b8.Name.d.ptr = local_b8.m_string.d.ptr;
      local_b8.m_string.d.ptr = pcVar4;
      local_b8.m_string.d.size = local_6b8.Name.d.size;
      local_6b8.Name.d.size = qVar11;
      if ((ProString *)pDVar3 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
             *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_178);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_148);
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((ProString *)local_e8.m_string.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_6b8.ParseFiles = _False;
      QVar15.m_size = (size_t)"";
      QVar15.field_0.m_data = &local_6b8.Filter;
      QString::assign(QVar15);
      QVar16.m_data = (storage_type *)0x26;
      QVar16.m_size = (qsizetype)local_88;
      QString::fromUtf8(QVar16);
      stack0xffffffffffffff90 = (char (*) [2])0x2aa61f;
      local_68 = this_01;
      QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_ProString_&>::
      convertTo<QString>(&local_b8.m_string,
                         (QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_ProString_&>
                          *)local_88);
      qVar11 = local_b8.m_string.d.size;
      pDVar5 = local_b8.m_string.d.d;
      pcVar4 = local_6b8.Guid.d.ptr;
      pDVar3 = local_6b8.Guid.d.d;
      local_b8.m_string.d.d = local_6b8.Guid.d.d;
      local_6b8.Guid.d.d = pDVar5;
      local_6b8.Guid.d.ptr = local_b8.m_string.d.ptr;
      local_b8.m_string.d.ptr = pcVar4;
      local_b8.m_string.d.size = local_6b8.Guid.d.size;
      local_6b8.Guid.d.size = qVar11;
      if ((ProString *)pDVar3 != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
             *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      firstExpandedOutputFileName((QString *)local_88,this,this_01);
      bVar6 = hasBuiltinCompiler((QString *)local_88);
      if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_88._0_8_)->d).d =
             *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if (bVar6) {
        lVar13 = (pPVar8->super_QList<ProString>).d.size;
        if (lVar13 != 0) {
          pPVar12 = (pPVar8->super_QList<ProString>).d.ptr;
          pPVar17 = pPVar12 + lVar13;
          do {
            bVar6 = ProStringList::contains((ProStringList *)&local_58,pPVar12,CaseSensitive);
            if ((!bVar6) &&
               (pPVar8 = QMakeEvaluator::valuesRef
                                   (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.
                                     project)->super_QMakeEvaluator,(ProKey *)pPVar12),
               (pPVar8->super_QList<ProString>).d.size != 0)) {
              lVar13 = 0;
              uVar14 = 0;
              do {
                ProString::toQString
                          (&local_e8.m_string,
                           (ProString *)
                           ((long)&(((pPVar8->super_QList<ProString>).d.ptr)->m_string).d.d + lVar13
                           ));
                pDVar2 = (this->extraCompilerSources).d;
                if (((pDVar2 != (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0) &&
                    (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::
                               findNode<QString>(pDVar2,&local_e8.m_string),
                    pNVar10 != (Node<QString,_QList<QString>_> *)0x0)) &&
                   (bVar6 = otherFiltersContain(this,&local_e8.m_string), !bVar6)) {
                  local_178.m_string.d.size = 0;
                  local_178.m_string.d.d = (Data *)0x0;
                  local_178.m_string.d.ptr = (char16_t *)0x0;
                  local_1a8.m_string.d.size = 0;
                  local_1a8.m_string.d.d = (Data *)0x0;
                  local_1a8.m_string.d.ptr = (char16_t *)0x0;
                  local_88._0_8_ = (ProString *)0x0;
                  local_88._8_8_ = (QString *)0x0;
                  local_88._16_8_ = 0;
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)local_88,0,&local_178.m_string);
                  QList<QString>::end((QList<QString> *)local_88);
                  local_b8.m_string.d.d = (Data *)0x0;
                  local_b8.m_string.d.ptr = (char16_t *)0x0;
                  local_b8.m_string.d.size = 0;
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&local_b8,0,&local_1a8.m_string);
                  QList<QString>::end((QList<QString> *)&local_b8);
                  (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.
                    super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xb])
                            (&local_148,this,&local_e8,(QArrayDataPointer<QString> *)local_88,
                             &local_b8);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&local_b8);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_88);
                  local_88._0_8_ = local_148.m_string.d.d;
                  local_88._8_8_ = local_148.m_string.d.ptr;
                  local_88._16_8_ = local_148.m_string.d.size;
                  if ((ProString *)local_148.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d +
                         1;
                    UNLOCK();
                  }
                  string.d.ptr = (char16_t *)pPVar17;
                  string.d.d = (Data *)pPVar12;
                  string.d.size = (qsizetype)pPVar7;
                  Option::fixString(&local_b8.m_string,string,(uchar)local_88);
                  if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_88._0_8_)->d).d =
                         *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
                    }
                  }
                  VCFilter::addFile(&local_6b8,&local_b8.m_string);
                  if ((ProString *)local_b8.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d == 0
                       ) {
                      QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((ProString *)local_148.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d ==
                        0) {
                      QArrayData::deallocate(&(local_148.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((ProString *)local_1a8.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d ==
                        0) {
                      QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((ProString *)local_178.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d ==
                        0) {
                      QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                if ((ProString *)local_e8.m_string.d.d != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d == 0)
                  {
                    QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                uVar14 = uVar14 + 1;
                lVar13 = lVar13 + 0x30;
              } while (uVar14 < (ulong)(pPVar8->super_QList<ProString>).d.size);
            }
            pPVar12 = pPVar12 + 1;
          } while (pPVar12 != pPVar17);
        }
LAB_002414a9:
        local_6b8.Project = this;
        local_6b8.Config = &(this->vcProject).Configuration;
        QtPrivate::QGenericArrayOps<VCFilter>::emplace<VCFilter_const&>
                  ((QGenericArrayOps<VCFilter> *)this_00,
                   (this->vcProject).ExtraCompilersFiles.d.size,&local_6b8);
        QList<VCFilter>::end(this_00);
      }
      else {
        pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        local_e8.m_string.d.ptr = L".variable_out";
        local_e8.m_string.d.d = (Data *)this_01;
        ProString::ProString<ProString_const&,char_const(&)[14]>
                  (&local_b8,(QStringBuilder<const_ProString_&,_const_char_(&)[14]> *)&local_e8);
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_b8);
        if ((ProString *)local_b8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((iStack_6c == 0) ||
           (bVar6 = ProStringList::contains
                              ((ProStringList *)&local_58,(ProString *)local_88,CaseSensitive),
           !bVar6)) {
          local_148.m_string.d.d = (Data *)0x0;
          local_148.m_string.d.ptr = (char16_t *)0x0;
          local_148.m_string.d.size = 0;
          if ((pPVar9->super_QList<ProString>).d.size != 0) {
            ProString::toQString(&local_b8.m_string,(pPVar9->super_QList<ProString>).d.ptr);
            qVar11 = local_b8.m_string.d.size;
            pDVar5 = local_b8.m_string.d.d;
            pcVar4 = local_148.m_string.d.ptr;
            pDVar3 = local_148.m_string.d.d;
            local_b8.m_string.d.d = local_148.m_string.d.d;
            local_148.m_string.d.d = pDVar5;
            local_148.m_string.d.ptr = local_b8.m_string.d.ptr;
            local_b8.m_string.d.ptr = pcVar4;
            local_b8.m_string.d.size = local_148.m_string.d.size;
            local_148.m_string.d.size = qVar11;
            if ((ProString *)pDVar3 != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
              }
            }
          }
          pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
          local_e8.m_string.d.ptr = L".CONFIG";
          local_e8.m_string.d.d = (Data *)this_01;
          ProString::ProString<ProString_const&,char_const(&)[8]>
                    (&local_b8,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_e8);
          vector = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_b8)->
                    super_QList<ProString>;
          qVar11 = QtPrivate::indexOf<ProString,char[8]>(vector,(char (*) [8])"combine",0);
          if ((ProString *)local_b8.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (qVar11 == -1) {
            if (((pPVar8->super_QList<ProString>).d.size != 0) &&
               (pPVar9 = QMakeEvaluator::valuesRef
                                   (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.
                                     project)->super_QMakeEvaluator,
                                    (ProKey *)(pPVar8->super_QList<ProString>).d.ptr),
               (pPVar9->super_QList<ProString>).d.size != 0)) {
              lVar13 = 0;
              uVar14 = 0;
              do {
                ProString::toQString
                          (&local_178.m_string,
                           (ProString *)
                           ((long)&(((pPVar9->super_QList<ProString>).d.ptr)->m_string).d.d + lVar13
                           ));
                pDVar2 = (this->extraCompilerSources).d;
                if (((pDVar2 != (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0) &&
                    (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::
                               findNode<QString>(pDVar2,&local_178.m_string),
                    pNVar10 != (Node<QString,_QList<QString>_> *)0x0)) &&
                   (bVar6 = otherFiltersContain(this,&local_178.m_string), !bVar6)) {
                  local_1d8.m_string.d.size = 0;
                  local_1d8.m_string.d.d = (Data *)0x0;
                  local_1d8.m_string.d.ptr = (char16_t *)0x0;
                  local_b8.m_string.d.d = (Data *)0x0;
                  local_b8.m_string.d.ptr = (char16_t *)0x0;
                  local_b8.m_string.d.size = 0;
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&local_b8,0,&local_148.m_string);
                  QList<QString>::end((QList<QString> *)&local_b8);
                  local_e8.m_string.d.d = (Data *)0x0;
                  local_e8.m_string.d.ptr = (char16_t *)0x0;
                  local_e8.m_string.d.size = 0;
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)&local_e8,0,&local_1d8.m_string);
                  QList<QString>::end((QList<QString> *)&local_e8);
                  (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.
                    super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xb])
                            (&local_1a8,this,&local_178,&local_b8,&local_e8,0);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&local_e8);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)&local_b8);
                  local_b8.m_string.d.d = local_1a8.m_string.d.d;
                  local_b8.m_string.d.ptr = local_1a8.m_string.d.ptr;
                  local_b8.m_string.d.size = local_1a8.m_string.d.size;
                  if ((ProString *)local_1a8.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d +
                         1;
                    UNLOCK();
                  }
                  string_01.d.ptr = (char16_t *)pPVar8;
                  string_01.d.d = (Data *)pPVar9;
                  string_01.d.size = (qsizetype)pPVar7;
                  Option::fixString(&local_e8.m_string,string_01,(uchar)&local_b8);
                  if ((ProString *)local_b8.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d == 0
                       ) {
                      QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  VCFilter::addFile(&local_6b8,&local_e8.m_string);
                  if ((ProString *)local_e8.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d == 0
                       ) {
                      QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((ProString *)local_1a8.m_string.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d ==
                        0) {
                      QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_1d8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_1d8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_1d8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_1d8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_1d8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                if ((ProString *)local_178.m_string.d.d != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d + -1
                  ;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d == 0)
                  {
                    QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                uVar14 = uVar14 + 1;
                lVar13 = lVar13 + 0x30;
              } while (uVar14 < (ulong)(pPVar9->super_QList<ProString>).d.size);
            }
          }
          else {
            local_238.m_string.d.d = (Data *)&local_148;
            local_238.m_string.d.ptr = (char16_t *)&this->customBuildToolFilterFileSuffix;
            QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
                      (&local_1a8.m_string,(QStringBuilder<QString_&,_const_QString_&> *)&local_238)
            ;
            local_1d8.m_string.d.size = 0;
            local_1d8.m_string.d.d = (Data *)0x0;
            local_1d8.m_string.d.ptr = (char16_t *)0x0;
            local_208.m_string.d.size = 0;
            local_208.m_string.d.d = (Data *)0x0;
            local_208.m_string.d.ptr = (char16_t *)0x0;
            local_b8.m_string.d.d = (Data *)0x0;
            local_b8.m_string.d.ptr = (char16_t *)0x0;
            local_b8.m_string.d.size = 0;
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)&local_b8,0,&local_1d8.m_string);
            QList<QString>::end((QList<QString> *)&local_b8);
            local_e8.m_string.d.d = (Data *)0x0;
            local_e8.m_string.d.ptr = (char16_t *)0x0;
            local_e8.m_string.d.size = 0;
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)&local_e8,0,&local_208.m_string);
            QList<QString>::end((QList<QString> *)&local_e8);
            (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo
              ._vptr_QMakeSourceFileInfo[0xb])(&local_178,this,&local_1a8,&local_b8,&local_e8);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_e8);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_b8);
            local_b8.m_string.d.d = local_178.m_string.d.d;
            local_b8.m_string.d.ptr = local_178.m_string.d.ptr;
            local_b8.m_string.d.size = local_178.m_string.d.size;
            if ((ProString *)local_178.m_string.d.d != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d + 1;
              UNLOCK();
            }
            string_00.d.ptr = (char16_t *)pPVar8;
            string_00.d.d = (Data *)pPVar9;
            string_00.d.size = (qsizetype)pPVar7;
            Option::fixString(&local_e8.m_string,string_00,(uchar)&local_b8);
            if ((ProString *)local_b8.m_string.d.d != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_b8.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            VCFilter::addFile(&local_6b8,&local_e8.m_string);
            if ((ProString *)local_e8.m_string.d.d != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_e8.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_e8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((ProString *)local_178.m_string.d.d != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_178.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_178.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_208.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_208.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_1d8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_1d8.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_1d8.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_1d8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((ProString *)local_1a8.m_string.d.d != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_1a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_1a8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          if ((ProString *)local_148.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_148.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_148.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_88._0_8_)->d).d =
                 *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          goto LAB_002414a9;
        }
        if ((ProString *)local_88._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_88._0_8_)->d).d =
               *(int *)&(((QString *)local_88._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_88._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
      }
      VCFilter::~VCFilter(&local_6b8);
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_118);
      this_01 = this_01 + 1;
    } while (this_01 !=
             (pPVar7->super_QList<ProString>).d.ptr + (pPVar7->super_QList<ProString>).d.size);
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VcprojGenerator::initExtraCompilerOutputs()
{
    ProStringList otherFilters;
    otherFilters << "FORMS"
                 << "GENERATED_FILES"
                 << "GENERATED_SOURCES"
                 << "HEADERS"
                 << "IDLSOURCES"
                 << "LEXSOURCES"
                 << "RC_FILE"
                 << "RESOURCES"
                 << "RES_FILE"
                 << "SOURCES"
                 << "TRANSLATIONS"
                 << "YACCSOURCES";
    const ProStringList &quc = project->values("QMAKE_EXTRA_COMPILERS");
    for (ProStringList::ConstIterator it = quc.begin(); it != quc.end(); ++it) {
        const ProStringList &inputVars = project->values(ProKey(*it + ".input"));
        ProStringList inputFiles;
        for (auto var : inputVars)
            inputFiles.append(project->values(var.toKey()));
        const ProStringList &outputs = project->values(ProKey(*it + ".output"));

        // Create an extra compiler filter and add the files
        VCFilter extraCompile;
        extraCompile.Name = extraCompilerName(it->toQString(), inputFiles.toQStringList(),
                                              outputs.toQStringList());
        extraCompile.ParseFiles = _False;
        extraCompile.Filter = "";
        extraCompile.Guid = QString(_GUIDExtraCompilerFiles) + "-" + (*it);

        bool addOnInput = hasBuiltinCompiler(firstExpandedOutputFileName(*it));
        if (!addOnInput) {
            // If the extra compiler has a variable_out set that is already handled
            // some other place, ignore it.
            const ProString &outputVar = project->first(ProKey(*it + ".variable_out"));
            if (!outputVar.isEmpty() && otherFilters.contains(outputVar))
                continue;

            QString tmp_out;
            if (!outputs.isEmpty())
                tmp_out = outputs.first().toQString();
            if (project->values(ProKey(*it + ".CONFIG")).indexOf("combine") != -1) {
                // Combined output, only one file result. Use .cbt file.
                extraCompile.addFile(Option::fixPathToTargetOS(
                        replaceExtraCompilerVariables(tmp_out + customBuildToolFilterFileSuffix,
                                                      QString(), QString(), NoShell), false));
            } else if (!inputVars.isEmpty()) {
                // One output file per input
                const ProStringList &tmp_in = project->values(inputVars.first().toKey());
                for (int i = 0; i < tmp_in.size(); ++i) {
                    const QString &filename = tmp_in.at(i).toQString();
                    if (extraCompilerSources.contains(filename) && !otherFiltersContain(filename))
                        extraCompile.addFile(Option::fixPathToTargetOS(
                                replaceExtraCompilerVariables(filename, tmp_out, QString(), NoShell), false));
                }
            }
        } else {
            // In this case we the outputs have a built-in compiler, so we cannot add the custom
            // build steps there. So, we turn it around and add it to the input files instead,
            // provided that the input file variable is not handled already (those in otherFilters
            // are handled, so we avoid them).
            for (const ProString &inputVar : inputVars) {
                if (!otherFilters.contains(inputVar)) {
                    const ProStringList &tmp_in = project->values(inputVar.toKey());
                    for (int i = 0; i < tmp_in.size(); ++i) {
                        const QString &filename = tmp_in.at(i).toQString();
                        if (extraCompilerSources.contains(filename) && !otherFiltersContain(filename))
                            extraCompile.addFile(Option::fixPathToTargetOS(
                                    replaceExtraCompilerVariables(filename, QString(), QString(), NoShell), false));
                    }
                }
            }
        }
        extraCompile.Project = this;
        extraCompile.Config = &(vcProject.Configuration);

        vcProject.ExtraCompilersFiles.append(extraCompile);
    }
}